

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction
          (EnvironmentNAVXYTHETALATTICE *this,EnvNAVXYTHETALATAction_t *action)

{
  vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *this_00;
  int iVar1;
  EnvNAVXYTHETALATAction_t *pEVar2;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *this_01;
  reference pvVar3;
  reference pvVar4;
  int iVar5;
  vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *this_02;
  size_type sVar6;
  int iVar7;
  size_type sVar8;
  value_type local_68;
  value_type local_58;
  vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_> *local_48;
  EnvNAVXYTHETALATAction_t *local_40;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *local_38;
  
  local_68.x = 0;
  local_68.y = 0;
  local_58.x = 0;
  local_58.y = 0;
  local_58.theta = 0;
  local_38 = &action->intersectingcellsV;
  this_00 = &this->affectedsuccstatesV;
  this_02 = &this->affectedpredstatesV;
  sVar6 = 0;
  local_48 = this_02;
  local_40 = action;
  while( true ) {
    this_01 = local_38;
    pEVar2 = local_40;
    local_68.theta = (int)local_40->starttheta;
    if ((long)(int)((ulong)((long)(local_40->intersectingcellsV).
                                  super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_40->intersectingcellsV).
                                 super__Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) <= (long)sVar6)
    break;
    pvVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at(local_38,sVar6);
    local_68.x = -pvVar3->x;
    pvVar3 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at(this_01,sVar6);
    iVar5 = -pvVar3->y;
    local_68.y = iVar5;
    if (this->bUseNonUniformAngles == true) {
      local_58.theta =
           (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
    }
    else {
      iVar5 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
      local_58.theta = (int)pEVar2->endtheta % iVar5;
      if (pEVar2->endtheta < '\0') {
        local_58.theta = (local_58.theta + iVar5) % iVar5;
      }
    }
    this_02 = local_48;
    local_58.x = pEVar2->dX + local_68.x;
    local_58.y = pEVar2->dY + local_68.y;
    for (sVar8 = 0;
        iVar5 = (int)(((long)(this->affectedsuccstatesV).
                             super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->affectedsuccstatesV).
                            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc),
        (long)sVar8 < (long)iVar5; sVar8 = sVar8 + 1) {
      pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                         (this_00,sVar8);
      if (((pvVar4->x == local_58.x) && (pvVar4->y == local_58.y)) &&
         (pvVar4->theta == local_58.theta)) {
        iVar5 = (int)(((long)(this->affectedsuccstatesV).
                             super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->affectedsuccstatesV).
                            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc);
        break;
      }
    }
    if (iVar5 == (int)sVar8) {
      std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
                (this_00,&local_58);
    }
    for (sVar8 = 0;
        iVar5 = (int)(((long)(this->affectedpredstatesV).
                             super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->affectedpredstatesV).
                            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc),
        (long)sVar8 < (long)iVar5; sVar8 = sVar8 + 1) {
      pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                         (this_02,sVar8);
      if (((pvVar4->x == local_68.x) && (pvVar4->y == local_68.y)) &&
         (pvVar4->theta == local_68.theta)) {
        iVar5 = (int)(((long)(this->affectedpredstatesV).
                             super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->affectedpredstatesV).
                            super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0xc);
        break;
      }
    }
    if (iVar5 == (int)sVar8) {
      std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
                (this_02,&local_68);
    }
    sVar6 = sVar6 + 1;
  }
  local_68.x = 0;
  local_68.y = 0;
  if (this->bUseNonUniformAngles == false) {
    iVar5 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
    local_58.theta = (int)local_40->endtheta % iVar5;
    local_58.y = 0;
    if (local_40->endtheta < '\0') {
      local_58.theta = (local_58.theta + iVar5) % iVar5;
      local_58.x = 0;
    }
    else {
      local_58.x = 0;
    }
  }
  else {
    local_58.theta =
         (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
    local_58.x = local_68.x;
    local_58.y = local_68.y;
  }
  local_58.x = pEVar2->dX + local_58.x;
  local_58.y = pEVar2->dY + local_58.y;
  for (sVar6 = 0;
      iVar5 = (int)(((long)(this->affectedsuccstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedsuccstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc),
      (long)sVar6 < (long)iVar5; sVar6 = sVar6 + 1) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       (this_00,sVar6);
    if (((pvVar4->x == local_58.x) && (pvVar4->y == local_58.y)) &&
       (pvVar4->theta == local_58.theta)) {
      iVar5 = (int)(((long)(this->affectedsuccstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedsuccstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      break;
    }
  }
  if (iVar5 == (int)sVar6) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              (this_00,&local_58);
  }
  for (sVar6 = 0;
      iVar5 = (int)(((long)(this->affectedpredstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedpredstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc),
      (long)sVar6 < (long)iVar5; sVar6 = sVar6 + 1) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       (this_02,sVar6);
    if (((pvVar4->x == local_68.x) && (pvVar4->y == local_68.y)) &&
       (pvVar4->theta == local_68.theta)) {
      iVar5 = (int)(((long)(this->affectedpredstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedpredstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      break;
    }
  }
  if (iVar5 == (int)sVar6) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              (this_02,&local_68);
  }
  pEVar2 = local_40;
  local_68.theta = (int)local_40->starttheta;
  iVar5 = (int)local_40->dX;
  local_68.x = -iVar5;
  iVar7 = (int)local_40->dY;
  local_68.y = -iVar7;
  if (this->bUseNonUniformAngles == true) {
    local_58.theta =
         (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x24])(this);
    iVar5 = (int)pEVar2->dX;
    iVar7 = (int)pEVar2->dY;
  }
  else {
    iVar1 = (this->EnvNAVXYTHETALATCfg).NumThetaDirs;
    local_58.theta = (int)local_40->endtheta % iVar1;
    if (local_40->endtheta < '\0') {
      local_58.theta = (local_58.theta + iVar1) % iVar1;
    }
  }
  local_58.y = iVar7 + local_68.y;
  local_58.x = iVar5 + local_68.x;
  for (sVar6 = 0;
      iVar5 = (int)(((long)(this->affectedsuccstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedsuccstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc),
      (long)sVar6 < (long)iVar5; sVar6 = sVar6 + 1) {
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       (this_00,sVar6);
    if (((pvVar4->x == local_58.x) && (pvVar4->y == local_58.y)) &&
       (pvVar4->theta == local_58.theta)) {
      iVar5 = (int)(((long)(this->affectedsuccstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedsuccstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      break;
    }
  }
  if (iVar5 == (int)sVar6) {
    std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
              (this_00,&local_58);
  }
  sVar6 = 0;
  do {
    iVar5 = (int)(((long)(this->affectedpredstatesV).
                         super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->affectedpredstatesV).
                        super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0xc);
    if ((long)iVar5 <= (long)sVar6) {
LAB_0012d10c:
      if (iVar5 == (int)sVar6) {
        std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::push_back
                  (this_02,&local_68);
      }
      return;
    }
    pvVar4 = std::vector<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>::at
                       (this_02,sVar6);
    if (((pvVar4->x == local_68.x) && (pvVar4->y == local_68.y)) &&
       (pvVar4->theta == local_68.theta)) {
      iVar5 = (int)(((long)(this->affectedpredstatesV).
                           super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->affectedpredstatesV).
                          super__Vector_base<sbpl_xy_theta_cell_t,_std::allocator<sbpl_xy_theta_cell_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      goto LAB_0012d10c;
    }
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

void EnvironmentNAVXYTHETALATTICE::ComputeReplanningDataforAction(
    EnvNAVXYTHETALATAction_t* action)
{
    int j;

    // iterate over all the cells involved in the action
    sbpl_xy_theta_cell_t startcell3d, endcell3d;
    for (int i = 0; i < (int)action->intersectingcellsV.size(); i++) {
        // compute the translated affected search Pose - what state has an
        // outgoing action whose intersecting cell is at 0,0
        startcell3d.theta = action->starttheta;
        startcell3d.x = -action->intersectingcellsV.at(i).x;
        startcell3d.y = -action->intersectingcellsV.at(i).y;

        // compute the translated affected search Pose - what state has an
        // incoming action whose intersecting cell is at 0,0
        if (bUseNonUniformAngles) {
            endcell3d.theta = normalizeDiscAngle(action->endtheta);
        }
        else {
            endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
        }
        endcell3d.x = startcell3d.x + action->dX;
        endcell3d.y = startcell3d.y + action->dY;

        //store the cells if not already there
        for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
            if (affectedsuccstatesV.at(j) == endcell3d) {
                break;
            }
        }
        if (j == (int)affectedsuccstatesV.size()) {
            affectedsuccstatesV.push_back(endcell3d);
        }

        for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
            if (affectedpredstatesV.at(j) == startcell3d) {
                break;
            }
        }
        if (j == (int)affectedpredstatesV.size()) {
            affectedpredstatesV.push_back(startcell3d);
        }
    } // over intersecting cells

    // add the centers since with h2d we are using these in cost computations
    // ---intersecting cell = origin
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -0;
    startcell3d.y = -0;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    //store the cells if not already there
    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }

    //---intersecting cell = outcome state
    // compute the translated affected search Pose - what state has an outgoing
    // action whose intersecting cell is at 0,0
    startcell3d.theta = action->starttheta;
    startcell3d.x = -action->dX;
    startcell3d.y = -action->dY;

    // compute the translated affected search Pose - what state has an incoming
    // action whose intersecting cell is at 0,0
    if (bUseNonUniformAngles) {
        endcell3d.theta = normalizeDiscAngle(action->endtheta);
    }
    else {
        endcell3d.theta = NORMALIZEDISCTHETA(action->endtheta, EnvNAVXYTHETALATCfg.NumThetaDirs);
    }
    endcell3d.x = startcell3d.x + action->dX;
    endcell3d.y = startcell3d.y + action->dY;

    for (j = 0; j < (int)affectedsuccstatesV.size(); j++) {
        if (affectedsuccstatesV.at(j) == endcell3d) {
            break;
        }
    }
    if (j == (int)affectedsuccstatesV.size()) {
        affectedsuccstatesV.push_back(endcell3d);
    }

    for (j = 0; j < (int)affectedpredstatesV.size(); j++) {
        if (affectedpredstatesV.at(j) == startcell3d) {
            break;
        }
    }
    if (j == (int)affectedpredstatesV.size()) {
        affectedpredstatesV.push_back(startcell3d);
    }
}